

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::readDataPostsolve(HinOut *this,HModel *ptr_model)

{
  size_type sVar1;
  long in_RSI;
  undefined4 *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *in_RDI = *(undefined4 *)(in_RSI + 0x60c);
  in_RDI[1] = *(undefined4 *)(in_RSI + 0x610);
  in_RDI[4] = *(int *)(in_RSI + 0x60c) + *(int *)(in_RSI + 0x610);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20c));
  in_RDI[0x1ea] = (int)sVar1;
  return;
}

Assistant:

void HinOut::readDataPostsolve(HModel & ptr_model) {
	numCol = ptr_model.numCol;
    numRow = ptr_model.numRow;
    numTot = ptr_model.numCol + ptr_model.numRow;
    Astart = ptr_model.Astart;
    Aindex = ptr_model.Aindex;
    Avalue = ptr_model.Avalue;
    colCost = ptr_model.colCost;
    colLower = ptr_model.colLower;
    colUpper = ptr_model.colUpper;
    rowLower = ptr_model.rowLower;
    rowUpper = ptr_model.rowUpper;

    AcountX = oAvalue.size();
}